

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

void CheckStackTraceLeaf(void)

{
  uint v1;
  string *psVar1;
  void *__ptr;
  void **v2;
  ulong uVar2;
  void *unaff_retaddr;
  CheckOpString local_f8;
  CheckOpString local_f0;
  LogMessage local_e8;
  void *stack [10];
  
  stack[0] = unaff_retaddr;
  psVar1 = google::Check_LTImpl<void_const*,void*>
                     (&expected_range[1].start,stack,"(&expected_range[1])->start < ra");
  if (psVar1 == (string *)0x0) {
    if (expected_range[1].end < stack[0]) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start);
      expected_range[1].end = stack[0];
    }
    expected_range[0].start = (void *)0x108bd8;
    expected_range[0].end = (void *)0x108d2d;
    v2 = &expected_range[0].end;
    psVar1 = google::Check_LTImpl<void_const*,void_const*>
                       (&expected_range[0].start,&expected_range[0].end,
                        "(&expected_range[0])->start < (&expected_range[0])->end");
    if (psVar1 == (string *)0x0) {
      v1 = google::GetStackTrace(stack,10,0);
      printf("Obtained %d stack frames.\n",(ulong)v1);
      psVar1 = google::Check_GEImpl_abi_cxx11_(v1,1,"size >= 1");
      if (psVar1 == (string *)0x0) {
        psVar1 = google::Check_LEImpl_abi_cxx11_(v1,10,"size <= STACK_LEN");
        if (psVar1 == (string *)0x0) {
          __ptr = (void *)backtrace_symbols(stack,v1);
          printf("Obtained %d stack frames.\n",(ulong)v1);
          if ((int)v1 < 1) {
            v1 = 0;
          }
          for (uVar2 = 0; v1 != uVar2; uVar2 = uVar2 + 1) {
            printf("%s %p\n",*(undefined8 *)((long)__ptr + uVar2 * 8),stack[uVar2]);
          }
          printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
          free(__ptr);
          uVar2 = 0;
          while( true ) {
            if (uVar2 == 6) {
              return;
            }
            printf("Backtrace %d: expected: %p..%p  actual: %p ... ",uVar2 & 0xffffffff,
                   ((AddressRange *)(v2 + -1))->start,*v2,stack[uVar2]);
            fflush(_stdout);
            local_f8.str_ = (string *)stack[uVar2];
            local_f0.str_ =
                 google::Check_GEImpl<void*,void_const*>
                           (&local_f8.str_,(void **)(v2 + -1),"ret_addr >= range.start");
            if (local_f0.str_ != (string *)0x0) break;
            local_f0.str_ =
                 google::Check_LEImpl<void*,void_const*>(&local_f8.str_,v2,"ret_addr <= range.end");
            if (local_f0.str_ != (string *)0x0) {
              google::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_e8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                         ,0x74,&local_f0);
              google::LogMessage::stream(&local_e8);
              goto LAB_00108e4a;
            }
            puts("OK");
            uVar2 = uVar2 + 1;
            v2 = v2 + 2;
          }
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                     ,0x73,&local_f0);
          google::LogMessage::stream(&local_e8);
        }
        else {
          local_f8.str_ = psVar1;
          google::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                     ,0x8a,&local_f8);
          google::LogMessage::stream(&local_e8);
        }
      }
      else {
        local_f8.str_ = psVar1;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                   ,0x89,&local_f8);
        google::LogMessage::stream(&local_e8);
      }
    }
    else {
      stack[0] = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
                 ,0x85,(CheckOpString *)stack);
      google::LogMessage::stream(&local_e8);
    }
  }
  else {
    local_f8.str_ = psVar1;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0x84,&local_f8);
    google::LogMessage::stream(&local_e8);
  }
LAB_00108e4a:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e8);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTraceLeaf() {
  const int STACK_LEN = 10;
  void* stack[STACK_LEN];
  int size;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);
  INIT_ADDRESS_RANGE(CheckStackTraceLeaf, start, end, &expected_range[0]);
  DECLARE_ADDRESS_LABEL(start);
  size = GetStackTrace(stack, STACK_LEN, 0);
  printf("Obtained %d stack frames.\n", size);
  CHECK_GE(size, 1);
  CHECK_LE(size, STACK_LEN);

  if (true) {
#  ifdef HAVE_EXECINFO_BACKTRACE_SYMBOLS
    char** strings = backtrace_symbols(stack, size);
    printf("Obtained %d stack frames.\n", size);
    for (int i = 0; i < size; i++) {
      printf("%s %p\n", strings[i], stack[i]);
    }

    union {
      void (*p1)(int);
      void* p2;
    } p = {&CheckStackTrace};

    printf("CheckStackTrace() addr: %p\n", p.p2);
    free(strings);
#  endif
  }
  for (int i = 0; i < BACKTRACE_STEPS; i++) {
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ", i,
           expected_range[i].start, expected_range[i].end, stack[i]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[i], expected_range[i]);
    printf("OK\n");
  }
  DECLARE_ADDRESS_LABEL(end);
}